

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpEventSubscribe.c
# Opt level: O0

int UpnpEventSubscribe_assign(UpnpEventSubscribe *p,UpnpEventSubscribe *q)

{
  int iVar1;
  UpnpString *pUVar2;
  bool bVar3;
  bool bVar4;
  undefined1 local_49;
  undefined4 local_1c;
  int ok;
  UpnpEventSubscribe *q_local;
  UpnpEventSubscribe *p_local;
  
  local_1c = 1;
  if (p != q) {
    iVar1 = UpnpEventSubscribe_get_ErrCode(q);
    iVar1 = UpnpEventSubscribe_set_ErrCode(p,iVar1);
    bVar3 = false;
    if (iVar1 != 0) {
      iVar1 = UpnpEventSubscribe_get_TimeOut(q);
      iVar1 = UpnpEventSubscribe_set_TimeOut(p,iVar1);
      bVar3 = iVar1 != 0;
    }
    bVar4 = false;
    if (bVar3) {
      pUVar2 = UpnpEventSubscribe_get_SID(q);
      iVar1 = UpnpEventSubscribe_set_SID(p,pUVar2);
      bVar4 = iVar1 != 0;
    }
    local_49 = false;
    if (bVar4) {
      pUVar2 = UpnpEventSubscribe_get_PublisherUrl(q);
      iVar1 = UpnpEventSubscribe_set_PublisherUrl(p,pUVar2);
      local_49 = iVar1 != 0;
    }
    local_1c = (uint)local_49;
  }
  return local_1c;
}

Assistant:

int UpnpEventSubscribe_assign(
	UpnpEventSubscribe *p, const UpnpEventSubscribe *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok && UpnpEventSubscribe_set_ErrCode(
				   p, UpnpEventSubscribe_get_ErrCode(q));
		ok = ok && UpnpEventSubscribe_set_TimeOut(
				   p, UpnpEventSubscribe_get_TimeOut(q));
		ok = ok && UpnpEventSubscribe_set_SID(
				   p, UpnpEventSubscribe_get_SID(q));
		ok = ok && UpnpEventSubscribe_set_PublisherUrl(
				   p, UpnpEventSubscribe_get_PublisherUrl(q));
	}

	return ok;
}